

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsInput
helicsFederateRegisterGlobalTypeInput
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  string_view type_00;
  string_view name;
  bool bVar1;
  Input *pIVar2;
  pointer pIVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *in_RDI;
  __sv_type _Var4;
  __single_object inp;
  shared_ptr<helics::ValueFederate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  HelicsFederate in_stack_ffffffffffffff48;
  ValueFederate *in_stack_ffffffffffffff70;
  shared_ptr<helics::ValueFederate> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
  *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffffa0;
  __shared_ptr local_40 [24];
  long local_28;
  long local_20;
  long local_18;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *local_10;
  HelicsInput local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  getValueFedSharedPtr(in_stack_ffffffffffffff48,(HelicsError *)in_stack_ffffffffffffff40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
  if (bVar1) {
    std::make_unique<helics::InputObject>();
    std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1ccd15);
    if (local_18 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff90 = (char *)_Var4._M_len;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (local_20 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff80 = (char *)_Var4._M_len;
      in_stack_ffffffffffffff88 =
           (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
           _Var4._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (local_28 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff70 = (ValueFederate *)_Var4._M_len;
      in_stack_ffffffffffffff78 = (shared_ptr<helics::ValueFederate> *)_Var4._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    name._M_str = in_stack_ffffffffffffff90;
    name._M_len = (size_t)in_stack_ffffffffffffff88;
    type_00._M_str = in_stack_ffffffffffffff80;
    type_00._M_len = (size_t)in_stack_ffffffffffffff78;
    pIVar2 = helics::ValueFederate::registerGlobalInput
                       (in_stack_ffffffffffffff70,name,type_00,in_stack_ffffffffffffffa0);
    pIVar3 = std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::
             operator->((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                         *)0x1ccdfb);
    pIVar3->inputPtr = pIVar2;
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::operator->
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               0x1cce0e);
    std::shared_ptr<helics::ValueFederate>::operator=
              (in_stack_ffffffffffffff78,
               (shared_ptr<helics::ValueFederate> *)in_stack_ffffffffffffff70);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::unique_ptr
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               in_stack_ffffffffffffff78,
               (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               in_stack_ffffffffffffff70);
    local_8 = anon_unknown.dwarf_5d1c2::addInput
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (local_10);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (local_10);
  }
  else {
    local_8 = (HelicsInput)0x0;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1ccf44)
  ;
  return local_8;
}

Assistant:

HelicsInput
    helicsFederateRegisterGlobalTypeInput(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto inp = std::make_unique<helics::InputObject>();
        inp->inputPtr = &(fedObj->registerGlobalInput(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units)));
        inp->fedptr = std::move(fedObj);
        return addInput(fed, std::move(inp));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}